

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall inja::ParserError::~ParserError(ParserError *this)

{
  InjaError::~InjaError(&this->super_InjaError);
  operator_delete(this,0x60);
  return;
}

Assistant:

explicit ParserError(const std::string& message, SourceLocation location): InjaError("parser_error", message, location) {}